

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.h
# Opt level: O2

uint HL::CPUInfo::getThreadId(void)

{
  pthread_t pVar1;
  
  pVar1 = pthread_self();
  return (uint)(pVar1 >> 0xc) & 0xfffff;
}

Assistant:

unsigned int CPUInfo::getThreadId() {
#if defined(__SVR4)
  return (unsigned int) pthread_self();
#elif defined(_WIN32)
  // It looks like thread id's are always multiples of 4, so...
  return GetCurrentThreadId() >> 2;
#elif defined(__APPLE__)
  // FIXME: is this page size dependent?
  // Consecutive thread id's in Mac OS are 4096 apart;
  // dividing off the 4096 gives us an appropriate thread id.
  unsigned int tid = (unsigned int) (((size_t) pthread_self()) >> 12);
  return tid;
#elif defined(__BEOS__)
  return find_thread(0);
#elif defined(__linux)
  return (unsigned int) ((size_t) pthread_self()) >> 12;
  //  return (unsigned int) syscall (SYS_gettid);
#elif defined(PTHREAD_KEYS_MAX)
  // As with Apple, above.
  return (unsigned int) ((size_t) pthread_self()) >> 12;
#elif defined(POSIX)
  return (unsigned int) pthread_self();
#elif USE_SPROC
  // This hairiness has the same effect as calling getpid(),
  // but it's MUCH faster since it avoids making a system call
  // and just accesses the sproc-local data directly.
  unsigned int pid = (unsigned int) PRDA->sys_prda.prda_sys.t_pid;
  return pid;
#else
#error "This platform is not currently supported."
  return 0;
#endif
}